

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp_number.hpp
# Opt level: O3

self_ * __thiscall
standards::exp_number<float>::operator*=(exp_number<float> *this,value_type_conflict v)

{
  exp_number<float> in_RAX;
  float fVar1;
  exp_number<float> local_18;
  
  local_18 = in_RAX;
  exp_number(&local_18,v);
  fVar1 = this->log_ + local_18.log_;
  this->log_ = fVar1;
  this->sign_ = this->sign_ * local_18.sign_;
  if (ABS(fVar1 / local_18.log_) < 1e-10) {
    this->log_ = 0.0;
  }
  return this;
}

Assistant:

self_& operator*=(self_ const& rhs) {
    log_ += rhs.log_;
    sign_ *= rhs.sign_;
    if (std::abs(log_/rhs.log_) < 1.0e-10) log_ = 0;
    return *this;
  }